

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

address __thiscall
pstore::index::
hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::store_leaf_node<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
          (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
           *this,transaction_base *transaction,
          pair<pstore::indirect_string,_pstore::index::details::empty_class> *v,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  archive_result_type<pstore::serialize::archive::database_writer_&> aVar3;
  uint8_t dummy;
  undefined1 local_49;
  writer_base<pstore::serialize::archive::details::database_writer_policy> local_48;
  
  (*transaction->_vptr_transaction_base[2])(transaction,0,4);
  local_48.bytes_consumed_ = 0;
  local_48.flushed_ = false;
  local_48._vptr_writer_base = (_func_int **)&PTR__writer_base_0026b400;
  local_48.policy_.transaction_ = transaction;
  aVar3 = serialize::serializer<pstore::indirect_string,void>::
          write_string_address<pstore::serialize::archive::database_writer&>
                    ((database_writer *)&local_48,&v->first);
  local_49 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_49;
  serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
  putn<pstore::gsl::span<unsigned_char_const,_1l>>
            (&local_48,(span<const_unsigned_char,__1L>)(auVar2 << 0x40));
  if ((aVar3.a_ & 3) != 0) {
    assert_failed("(result.absolute () & (aligned_to - 1U)) == 0U",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x2d5);
  }
  uVar1 = (parents.ptr_)->elements_;
  if (uVar1 < 0xd) {
    (parents.ptr_)->elements_ = uVar1 + 1;
    ((parents.ptr_)->c_)._M_elems[uVar1].node.addr_.a_ = aVar3.a_;
    ((parents.ptr_)->c_)._M_elems[uVar1].position = 0xffffffffffffffff;
    return (address)aVar3.a_;
  }
  assert_failed("elements_ < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                ,100);
}

Assistant:

address hamt_map<KeyType, ValueType, Hash, KeyEqual>::store_leaf_node (
            transaction_base & transaction, OtherValueType const & v,
            gsl::not_null<parent_stack *> const parents) {

            // Make sure the alignment of leaf node is 4 to ensure that the two LSB are guaranteed
            // 0. If 'v' has greater alignment, serialize::write() will add additional padding.
            constexpr auto aligned_to = std::size_t{4};
            static_assert ((details::internal_node_bit | details::heap_node_bit) == aligned_to - 1,
                           "expected required alignment to be 4");
            transaction.allocate (0, aligned_to);

            // Now write the node and return where it went.
            address const result =
                serialize::write (serialize::archive::make_writer (transaction), v);
            PSTORE_ASSERT ((result.absolute () & (aligned_to - 1U)) == 0U);
            parents->push (details::parent_type{index_pointer{result}});

            return result;
        }